

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O0

void helper_mttc0_tchalt_mips64el(CPUMIPSState_conflict5 *env,target_ulong arg1)

{
  CPUMIPSState_conflict5 *env_00;
  ArchCPU_conflict7 *cpu;
  MIPSCPU_conflict2 *other_cpu;
  CPUMIPSState_conflict5 *other;
  target_ulong tStack_18;
  int other_tc;
  target_ulong arg1_local;
  CPUMIPSState_conflict5 *env_local;
  
  other._4_4_ = env->CP0_VPEControl & 0xff;
  tStack_18 = arg1;
  arg1_local = (target_ulong)env;
  env_00 = mips_cpu_map_tc(env,(int *)((long)&other + 4));
  cpu = env_archcpu(env_00);
  if (other._4_4_ == env_00->current_tc) {
    (env_00->active_tc).CP0_TCHalt = tStack_18;
  }
  else {
    env_00->tcs[(int)other._4_4_].CP0_TCHalt = tStack_18;
  }
  if ((tStack_18 & 1) == 0) {
    mips_tc_wake(cpu,other._4_4_);
  }
  else {
    mips_tc_sleep(cpu,other._4_4_);
  }
  return;
}

Assistant:

void helper_mttc0_tchalt(CPUMIPSState *env, target_ulong arg1)
{
    int other_tc = env->CP0_VPEControl & (0xff << CP0VPECo_TargTC);
    CPUMIPSState *other = mips_cpu_map_tc(env, &other_tc);
    MIPSCPU *other_cpu = env_archcpu(other);

    /* TODO: Halt TC / Restart (if allocated+active) TC. */

    if (other_tc == other->current_tc) {
        other->active_tc.CP0_TCHalt = arg1;
    } else {
        other->tcs[other_tc].CP0_TCHalt = arg1;
    }

    if (arg1 & 1) {
        mips_tc_sleep(other_cpu, other_tc);
    } else {
        mips_tc_wake(other_cpu, other_tc);
    }
}